

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

void nni_posix_pollq_sysfini(void)

{
  int local_c;
  int i;
  
  if (0 < nni_epoll_npq) {
    for (local_c = 0; local_c < nni_epoll_npq; local_c = local_c + 1) {
      nni_epoll_pq_destroy(nni_epoll_pqs + local_c);
    }
    nni_free(nni_epoll_pqs,(long)nni_epoll_npq * 0x120);
    nni_epoll_pqs = (nni_posix_pollq *)0x0;
    nni_epoll_npq = 0;
  }
  return;
}

Assistant:

void
nni_posix_pollq_sysfini(void)
{
	if (nni_epoll_npq > 0) {
		for (int i = 0; i < nni_epoll_npq; i++) {
			nni_epoll_pq_destroy(&nni_epoll_pqs[i]);
		}
		NNI_FREE_STRUCTS(nni_epoll_pqs, nni_epoll_npq);
		nni_epoll_pqs = NULL;
		nni_epoll_npq = 0;
	}
}